

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall QSslSocketPrivate::_q_bytesWrittenSlot(QSslSocketPrivate *this,qint64 written)

{
  QSslSocket *this_00;
  long lVar1;
  
  this_00 = *(QSslSocket **)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x8;
  if (this->mode == UnencryptedMode) {
    QIODevice::bytesWritten((longlong)this_00);
  }
  else {
    QSslSocket::encryptedBytesWritten(this_00,written);
  }
  if (((this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state == ClosingState) &&
     ((lVar1 = *(long *)&(this->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x98,
      lVar1 == 0 || (*(long *)(lVar1 + 0x18) == 0)))) {
    (**(code **)(*(long *)&(this_00->super_QTcpSocket).super_QAbstractSocket + 0x100))(this_00);
    return;
  }
  return;
}

Assistant:

void QSslSocketPrivate::_q_bytesWrittenSlot(qint64 written)
{
    Q_Q(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_bytesWrittenSlot(" << written << ')';
#endif

    if (mode == QSslSocket::UnencryptedMode)
        emit q->bytesWritten(written);
    else
        emit q->encryptedBytesWritten(written);
    if (state == QAbstractSocket::ClosingState && writeBuffer.isEmpty())
        q->disconnectFromHost();
}